

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::FlushAndResetBuffer
          (EpsCopyOutputStream *this,uint8_t *ptr)

{
  int size;
  int s;
  uint8_t *ptr_local;
  EpsCopyOutputStream *this_local;
  
  if ((this->had_error_ & 1U) == 0) {
    size = Flush(this,ptr);
    if ((this->had_error_ & 1U) == 0) {
      this_local = (EpsCopyOutputStream *)SetInitialBuffer(this,this->buffer_end_,size);
    }
    else {
      this_local = (EpsCopyOutputStream *)this->buffer_;
    }
  }
  else {
    this_local = (EpsCopyOutputStream *)this->buffer_;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* EpsCopyOutputStream::FlushAndResetBuffer(uint8_t* ptr) {
  if (had_error_) return buffer_;
  int s = Flush(ptr);
  if (had_error_) return buffer_;
  return SetInitialBuffer(buffer_end_, s);
}